

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_atexit.c
# Opt level: O1

int portability_atexit_initialize(void)

{
  atexit_node_type *paVar1;
  
  if (atexit_list == (atexit_node_type *)0x0) {
    paVar1 = (atexit_node_type *)malloc(0x10);
    if (paVar1 == (atexit_node_type *)0x0) {
      atexit_list = paVar1;
      return 1;
    }
    atexit_list = paVar1;
    paVar1->handler = (portability_atexit_fn)0x0;
    paVar1->next = (atexit_node_type *)0x0;
  }
  if (portability_atexit_initialize_atexit_registered == '\0') {
    atexit(portability_atexit_destroy);
    portability_atexit_initialize_atexit_registered = '\x01';
  }
  return 0;
}

Assistant:

int portability_atexit_initialize(void)
{
	static int atexit_registered = 0;

	if (atexit_list == NULL)
	{
		atexit_list = malloc(sizeof(struct atexit_node_type));

		if (atexit_list == NULL)
		{
			return 1;
		}

		atexit_list->handler = NULL;
		atexit_list->next = NULL;
	}

	if (atexit_registered == 0)
	{
		atexit(&portability_atexit_destroy);
		atexit_registered = 1;
	}

	return 0;
}